

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O3

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
CompatibleTypes<proto2_unittest::TestAllTypes>::TestBody
          (CompatibleTypes<proto2_unittest::TestAllTypes> *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  pointer *__ptr;
  InternalMetadata IVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar4;
  char *pcVar5;
  pointer message;
  char *in_R9;
  pointer *__ptr_2;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  Uint32Message msg5;
  Int32Message msg4;
  Uint64Message msg3;
  string serialized;
  BoolMessage msg2;
  Int64Message msg1;
  AssertHelper local_118;
  AssertHelper local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  undefined1 local_100 [8];
  InternalMetadata local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [8];
  InternalMetadata local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [8];
  InternalMetadata local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  AssertHelper local_80;
  string local_78;
  BoolMessage local_58;
  Int64Message local_38;
  
  proto2_unittest::Int64Message::Int64Message(&local_38,(Arena *)0x0);
  local_38.field_0._impl_.data_ = 0x100000000;
  local_38.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_38.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  MessageLite::SerializeToString((MessageLite *)&local_38,&local_78);
  proto2_unittest::BoolMessage::BoolMessage(&local_58,(Arena *)0x0);
  data._M_str = local_78._M_dataplus._M_p;
  data._M_len = local_78._M_string_length;
  local_c0[0] = (internal)MessageLite::ParseFromString((MessageLite *)&local_58,data);
  local_b8.ptr_ = 0;
  if ((bool)local_c0[0]) {
    local_c0[0] = (internal)0x1;
    local_100[0] = (internal)local_58.field_0._impl_.data_;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_a0,"static_cast<bool>(data)","msg2.data()",(bool *)local_c0,
               (bool *)local_100);
    if (local_a0[0] != (internal)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_98.ptr_);
      }
      proto2_unittest::Uint64Message::Uint64Message((Uint64Message *)local_a0,(Arena *)0x0);
      data_00._M_str = local_78._M_dataplus._M_p;
      data_00._M_len = local_78._M_string_length;
      bVar2 = MessageLite::ParseFromString((MessageLite *)local_a0,data_00);
      local_100[0] = (internal)bVar2;
      local_f8.ptr_ = 0;
      if (bVar2) {
        local_100 = (undefined1  [8])0x100000000;
        local_e0 = (undefined1  [8])local_90._8_8_;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_c0,"static_cast<uint64_t>(data)","msg3.data()",
                   (unsigned_long *)local_100,(unsigned_long *)local_e0);
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_100);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = *(char **)local_b8.ptr_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x438,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
          if (local_100 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_100 + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8;
            IVar3.ptr_ = local_b8.ptr_;
            goto LAB_009cf9a5;
          }
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8.ptr_);
          }
          proto2_unittest::Int32Message::Int32Message((Int32Message *)local_c0,(Arena *)0x0);
          data_01._M_str = local_78._M_dataplus._M_p;
          data_01._M_len = local_78._M_string_length;
          bVar2 = MessageLite::ParseFromString((MessageLite *)local_c0,data_01);
          auVar1 = local_e0;
          local_e0[0] = (internal)bVar2;
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar2) {
            local_e0 = (undefined1  [8])((ulong)auVar1 & 0xffffffff00000000);
            local_110.data_._0_4_ = local_b0._8_4_;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_100,"static_cast<int32_t>(data)","msg4.data()",
                       (int *)local_e0,(int *)&local_110);
            if (local_100[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_e0);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_
                  == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = anon_var_dwarf_a22956 + 5;
              }
              else {
                pcVar5 = *(char **)local_f8.ptr_;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_110,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                         ,0x43d,pcVar5);
              testing::internal::AssertHelper::operator=(&local_110,(Message *)local_e0);
              testing::internal::AssertHelper::~AssertHelper(&local_110);
              if (local_e0 != (undefined1  [8])0x0) {
                (**(code **)(*(size_type *)local_e0 + 8))();
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_
                  != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f8;
                IVar3.ptr_ = local_f8.ptr_;
                goto LAB_009cfada;
              }
            }
            else {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_
                  != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f8.ptr_);
              }
              proto2_unittest::Uint32Message::Uint32Message((Uint32Message *)local_100,(Arena *)0x0)
              ;
              data_02._M_str = local_78._M_dataplus._M_p;
              data_02._M_len = local_78._M_string_length;
              bVar2 = MessageLite::ParseFromString((MessageLite *)local_100,data_02);
              local_110.data_._0_4_ = CONCAT31(local_110.data_._1_3_,bVar2);
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (bVar2) {
                local_110.data_._0_4_ = 0;
                local_118.data_._0_4_ = local_f0._8_4_;
                testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                          ((internal *)local_e0,"static_cast<uint32_t>(data)","msg5.data()",
                           (uint *)&local_110,(uint *)&local_118);
                if (local_e0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_110);
                  if (local_d8 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    message = anon_var_dwarf_a22956 + 5;
                  }
                  else {
                    message = (local_d8->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_118,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                             ,0x442,message);
                  testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
                  testing::internal::AssertHelper::~AssertHelper(&local_118);
                  if ((long *)CONCAT44(local_110.data_._4_4_,(int32_t)local_110.data_) !=
                      (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,(int32_t)local_110.data_) +
                                8))();
                  }
                }
                if (local_d8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d8;
                  __ptr_00 = local_d8;
LAB_009cfb35:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(pdVar4,__ptr_00);
                }
              }
              else {
                pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_108;
                testing::Message::Message((Message *)&local_118);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_e0,(internal *)&local_110,
                           (AssertionResult *)"msg5.ParseFromString(serialized)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                           ,0x441,(char *)local_e0);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_118);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                if (local_e0 != (undefined1  [8])&local_d0) {
                  operator_delete((void *)local_e0,local_d0._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_118.data_._4_4_,(uint32_t)local_118.data_) != (long *)0x0
                   ) {
                  (**(code **)(*(long *)CONCAT44(local_118.data_._4_4_,(uint32_t)local_118.data_) +
                              8))();
                }
                __ptr_00 = local_108;
                if (local_108 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                goto LAB_009cfb35;
              }
              proto2_unittest::Uint32Message::~Uint32Message((Uint32Message *)local_100);
            }
          }
          else {
            pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8;
            testing::Message::Message((Message *)&local_110);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_100,(internal *)local_e0,
                       (AssertionResult *)"msg4.ParseFromString(serialized)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_118,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                       ,0x43c,(char *)local_100);
            testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
            testing::internal::AssertHelper::~AssertHelper(&local_118);
            if (local_100 != (undefined1  [8])&local_f0) {
              operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_110.data_._4_4_,(int32_t)local_110.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,(int32_t)local_110.data_) + 8))()
              ;
            }
            IVar3.ptr_ = (intptr_t)local_d8;
            if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
LAB_009cfada:
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(pdVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)IVar3.ptr_);
            }
          }
          proto2_unittest::Int32Message::~Int32Message((Int32Message *)local_c0);
        }
      }
      else {
        pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8;
        testing::Message::Message((Message *)local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c0,(internal *)local_100,
                   (AssertionResult *)"msg3.ParseFromString(serialized)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x437,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0._M_allocated_capacity + 1
                         );
        }
        if (local_e0 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_e0 + 8))();
        }
        IVar3.ptr_ = local_f8.ptr_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_009cf9a5:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              IVar3.ptr_);
        }
      }
      proto2_unittest::Uint64Message::~Uint64Message((Uint64Message *)local_a0);
      goto LAB_009cfb58;
    }
    testing::Message::Message((Message *)local_c0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = *(char **)local_98.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x433,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_100,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_100);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c0._1_7_,local_c0[0]) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_009cfb58;
    pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_98;
  }
  else {
    testing::Message::Message((Message *)local_100);
    pdVar4 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_b8;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)local_c0,
               (AssertionResult *)"msg2.ParseFromString(serialized)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x432,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_100 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_100 + 8))();
    }
    local_98.ptr_ = local_b8.ptr_;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_009cfb58;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_98.ptr_);
LAB_009cfb58:
  proto2_unittest::BoolMessage::~BoolMessage(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::Int64Message::~Int64Message(&local_38);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, CompatibleTypes) {
  const int64_t data = 0x100000000LL;
  typename TestFixture::Int64Message msg1;
  msg1.set_data(data);
  std::string serialized;
  msg1.SerializeToString(&serialized);

  // Test int64 is compatible with bool
  typename TestFixture::BoolMessage msg2;
  ASSERT_TRUE(msg2.ParseFromString(serialized));
  ASSERT_EQ(static_cast<bool>(data), msg2.data());

  // Test int64 is compatible with uint64
  typename TestFixture::Uint64Message msg3;
  ASSERT_TRUE(msg3.ParseFromString(serialized));
  ASSERT_EQ(static_cast<uint64_t>(data), msg3.data());

  // Test int64 is compatible with int32
  typename TestFixture::Int32Message msg4;
  ASSERT_TRUE(msg4.ParseFromString(serialized));
  ASSERT_EQ(static_cast<int32_t>(data), msg4.data());

  // Test int64 is compatible with uint32
  typename TestFixture::Uint32Message msg5;
  ASSERT_TRUE(msg5.ParseFromString(serialized));
  ASSERT_EQ(static_cast<uint32_t>(data), msg5.data());
}